

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txreconciliation_tests.cpp
# Opt level: O2

void __thiscall
txreconciliation_tests::IsPeerRegisteredTest::IsPeerRegisteredTest(IsPeerRegisteredTest *this)

{
  long lVar1;
  TestOpts opts;
  long in_FS_OFFSET;
  uint in_stack_ffffffffffffffe4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  opts.coins_db_in_memory = true;
  opts.block_tree_db_in_memory = true;
  opts.setup_net = true;
  opts.setup_validation_interface = true;
  opts._28_4_ = in_stack_ffffffffffffffe4 & 0xffffff00;
  BasicTestingSetup::BasicTestingSetup(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,MAIN,opts);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)&stack0xffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(IsPeerRegisteredTest)
{
    TxReconciliationTracker tracker(TXRECONCILIATION_VERSION);
    NodeId peer_id0 = 0;

    BOOST_REQUIRE(!tracker.IsPeerRegistered(peer_id0));
    tracker.PreRegisterPeer(peer_id0);
    BOOST_REQUIRE(!tracker.IsPeerRegistered(peer_id0));

    BOOST_REQUIRE_EQUAL(tracker.RegisterPeer(peer_id0, true, 1, 1), ReconciliationRegisterResult::SUCCESS);
    BOOST_CHECK(tracker.IsPeerRegistered(peer_id0));

    tracker.ForgetPeer(peer_id0);
    BOOST_CHECK(!tracker.IsPeerRegistered(peer_id0));
}